

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall google::protobuf::Reflection::Swap(Reflection *this,Message *lhs,Message *rhs)

{
  bool bVar1;
  Reflection **ppRVar2;
  Reflection **ppRVar3;
  LogMessage *pLVar4;
  Descriptor *pDVar5;
  DescriptorStringView psVar6;
  Message *this_00;
  undefined1 auVar7 [16];
  Message *temp;
  Arena *arena;
  LogMessageFatal local_b0 [23];
  Voidify local_99;
  Reflection *local_98;
  Reflection *local_90;
  string *local_88;
  string *absl_log_internal_check_op_result_1;
  undefined1 local_70 [16];
  LogMessageFatal local_60 [23];
  Voidify local_49;
  Reflection *local_48;
  Reflection *local_40;
  string *local_38;
  string *absl_log_internal_check_op_result;
  Arena *rhs_arena;
  Arena *lhs_arena;
  Message *rhs_local;
  Message *lhs_local;
  Reflection *this_local;
  
  if (lhs != rhs) {
    lhs_arena = (Arena *)rhs;
    rhs_local = lhs;
    lhs_local = (Message *)this;
    rhs_arena = MessageLite::GetArena(&lhs->super_MessageLite);
    absl_log_internal_check_op_result = (string *)MessageLite::GetArena((MessageLite *)lhs_arena);
    local_40 = Message::GetReflection(rhs_local);
    ppRVar2 = absl::lts_20240722::log_internal::
              GetReferenceableValue<google::protobuf::Reflection_const*>(&local_40);
    local_48 = this;
    ppRVar3 = absl::lts_20240722::log_internal::
              GetReferenceableValue<google::protobuf::Reflection_const*>(&local_48);
    local_38 = absl::lts_20240722::log_internal::
               Check_EQImpl<google::protobuf::Reflection_const*,google::protobuf::Reflection_const*>
                         (ppRVar2,ppRVar3,"lhs->GetReflection() == this");
    if (local_38 != (string *)0x0) {
      local_70 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_60,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_reflection.cc"
                 ,0x435,local_70._0_8_,local_70._8_8_);
      pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_60);
      pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<
                         (pLVar4,(char (*) [36])"First argument to Swap() (of type \"");
      pDVar5 = Message::GetDescriptor(rhs_local);
      psVar6 = Descriptor::full_name_abi_cxx11_(pDVar5);
      pLVar4 = (LogMessage *)
               absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar4,(string *)psVar6);
      pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<
                         (pLVar4,(char (*) [70])
                                 "\") is not compatible with this reflection object (which is for type \""
                         );
      psVar6 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
      pLVar4 = (LogMessage *)
               absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar4,(string *)psVar6);
      pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<
                         (pLVar4,(char (*) [79])
                                 "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_49,pLVar4);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_60);
    }
    local_90 = Message::GetReflection((Message *)lhs_arena);
    ppRVar2 = absl::lts_20240722::log_internal::
              GetReferenceableValue<google::protobuf::Reflection_const*>(&local_90);
    local_98 = this;
    ppRVar3 = absl::lts_20240722::log_internal::
              GetReferenceableValue<google::protobuf::Reflection_const*>(&local_98);
    local_88 = absl::lts_20240722::log_internal::
               Check_EQImpl<google::protobuf::Reflection_const*,google::protobuf::Reflection_const*>
                         (ppRVar2,ppRVar3,"rhs->GetReflection() == this");
    if (local_88 != (string *)0x0) {
      auVar7 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_88);
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_reflection.cc"
                 ,0x43d,auVar7._0_8_,auVar7._8_8_);
      pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_b0);
      pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<
                         (pLVar4,(char (*) [37])"Second argument to Swap() (of type \"");
      pDVar5 = Message::GetDescriptor((Message *)lhs_arena);
      psVar6 = Descriptor::full_name_abi_cxx11_(pDVar5);
      pLVar4 = (LogMessage *)
               absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar4,(string *)psVar6);
      pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<
                         (pLVar4,(char (*) [70])
                                 "\") is not compatible with this reflection object (which is for type \""
                         );
      psVar6 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
      pLVar4 = (LogMessage *)
               absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar4,(string *)psVar6);
      pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<
                         (pLVar4,(char (*) [79])
                                 "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_99,pLVar4);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_b0);
    }
    bVar1 = internal::CanUseInternalSwap(rhs_arena,(Arena *)absl_log_internal_check_op_result);
    if (bVar1) {
      UnsafeArenaSwap(this,rhs_local,(Message *)lhs_arena);
    }
    else {
      temp = (Message *)rhs_arena;
      if (rhs_arena == (Arena *)0x0) {
        temp = (Message *)absl_log_internal_check_op_result;
        std::swap<google::protobuf::Message*>(&rhs_local,(Message **)&lhs_arena);
      }
      this_00 = Message::New(rhs_local,(Arena *)temp);
      Message::MergeFrom(this_00,(Message *)lhs_arena);
      Message::CopyFrom((Message *)lhs_arena,rhs_local);
      Swap(this,rhs_local,this_00);
    }
  }
  return;
}

Assistant:

void Reflection::Swap(Message* lhs, Message* rhs) const {
  if (lhs == rhs) return;

  Arena* lhs_arena = lhs->GetArena();
  Arena* rhs_arena = rhs->GetArena();

  // TODO:  Other Reflection methods should probably check this too.
  ABSL_CHECK_EQ(lhs->GetReflection(), this)
      << "First argument to Swap() (of type \""
      << lhs->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";
  ABSL_CHECK_EQ(rhs->GetReflection(), this)
      << "Second argument to Swap() (of type \""
      << rhs->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";

  // Check that both messages are in the same arena (or both on the heap). We
  // need to copy all data if not, due to ownership semantics.
  if (!internal::CanUseInternalSwap(lhs_arena, rhs_arena)) {
    // One of the two is guaranteed to have an arena.  Switch things around
    // to guarantee that lhs has an arena.
    Arena* arena = lhs_arena;
    if (arena == nullptr) {
      arena = rhs_arena;
      std::swap(lhs, rhs);  // Swapping names for pointers!
    }

    Message* temp = lhs->New(arena);
    temp->MergeFrom(*rhs);
    rhs->CopyFrom(*lhs);
    if (internal::DebugHardenForceCopyInSwap()) {
      lhs->CopyFrom(*temp);
      if (arena == nullptr) delete temp;
    } else {
      Swap(lhs, temp);
    }
    return;
  }

  UnsafeArenaSwap(lhs, rhs);
}